

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bitileave.cpp
# Opt level: O1

void __thiscall
bitmanip::anon_unknown_0::Test_bitileave_duplBits_naive_manual_::run
          (Test_bitileave_duplBits_naive_manual_ *this)

{
  string_view msg;
  string_view msg_00;
  string_view msg_01;
  string_view msg_02;
  string_view msg_03;
  string_view msg_04;
  string_view msg_05;
  string_view msg_06;
  string_view msg_07;
  SourceLocation loc;
  SourceLocation loc_00;
  SourceLocation loc_01;
  SourceLocation loc_02;
  SourceLocation loc_03;
  SourceLocation loc_04;
  SourceLocation loc_05;
  SourceLocation loc_06;
  SourceLocation loc_07;
  char cVar1;
  size_t i_4;
  long *plVar2;
  long *plVar3;
  size_t b_out;
  unsigned_long *puVar4;
  long *plVar5;
  uint64_t result;
  uint64_t result_3;
  ulong uVar6;
  size_t j_3;
  long lVar7;
  size_t j;
  long lVar8;
  bool bVar9;
  undefined4 in_stack_fffffffffffffe40;
  uint uVar10;
  long local_1a8;
  long lStack_1a0;
  ulong local_198;
  _Alloc_hider _Var11;
  size_type sVar12;
  undefined8 uVar13;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  char *local_f0;
  char *pcStack_e8;
  undefined8 local_e0;
  char *local_d8;
  char *pcStack_d0;
  undefined8 local_c8;
  char *local_c0;
  char *pcStack_b8;
  undefined8 local_b0;
  char *local_a8;
  char *pcStack_a0;
  undefined8 local_98;
  char *local_90;
  char *pcStack_88;
  undefined8 local_80;
  char *local_78;
  char *pcStack_70;
  undefined8 local_68;
  char *local_60;
  char *pcStack_58;
  undefined8 local_50;
  char *local_48;
  char *pcStack_40;
  undefined8 local_38;
  char *local_30;
  char *pcStack_28;
  undefined8 local_20;
  
  cVar1 = '\0';
  uVar6 = 0;
  local_198 = 0;
  do {
    lVar8 = 0;
    do {
      local_198 = local_198 |
                  (ulong)((0xfUL >> (uVar6 & 0x3f) & 1) != 0) << (cVar1 + (char)lVar8 & 0x3fU);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 2);
    cVar1 = cVar1 + '\x02';
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0x20);
  uVar10 = 0xff;
  if (local_198 != 0xff) {
    detail::stringify_impl<unsigned_long>(&local_150,&local_198);
    std::operator+(&local_130,
                   "Comparison failed: detail::duplBits_naive(0xf, 2) == 0xffu (with \"detail::duplBits_naive(0xf, 2)\"="
                   ,&local_150);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_130);
    _Var11._M_p = (pointer)*plVar2;
    puVar4 = (unsigned_long *)(plVar2 + 2);
    if ((unsigned_long *)_Var11._M_p == puVar4) {
      uVar13 = *puVar4;
      _Var11._M_p = &stack0xfffffffffffffe80;
    }
    else {
      uVar13 = *puVar4;
    }
    sVar12 = plVar2[1];
    *plVar2 = (long)puVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    detail::stringify_impl<unsigned_int>(&local_170,(uint *)&stack0xfffffffffffffe44);
    std::operator+(&local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffe70,&local_170);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_110);
    plVar2 = (long *)*plVar3;
    plVar5 = plVar3 + 2;
    if (plVar2 == plVar5) {
      local_1a8 = *plVar5;
      lStack_1a0 = plVar3[3];
      plVar2 = &local_1a8;
    }
    else {
      local_1a8 = *plVar5;
    }
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_30 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    pcStack_28 = "run";
    local_20 = 0x1a;
    msg._M_len._4_4_ = uVar10;
    msg._M_len._0_4_ = in_stack_fffffffffffffe40;
    msg._M_str = (char *)plVar2;
    loc.function = (char *)sVar12;
    loc.file = _Var11._M_p;
    loc.line = uVar13;
    assertFail(msg,loc);
  }
  cVar1 = '\0';
  uVar6 = 0;
  local_198 = 0;
  do {
    lVar8 = 0;
    do {
      local_198 = local_198 |
                  (ulong)((0x55UL >> (uVar6 & 0x3f) & 1) != 0) << (cVar1 + (char)lVar8 & 0x3fU);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 2);
    cVar1 = cVar1 + '\x02';
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0x20);
  uVar10 = 0x3333;
  if (local_198 != 0x3333) {
    detail::stringify_impl<unsigned_long>(&local_150,&local_198);
    std::operator+(&local_130,
                   "Comparison failed: detail::duplBits_naive(0x55, 2) == 0x3333u (with \"detail::duplBits_naive(0x55, 2)\"="
                   ,&local_150);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_130);
    _Var11._M_p = (pointer)*plVar2;
    puVar4 = (unsigned_long *)(plVar2 + 2);
    if ((unsigned_long *)_Var11._M_p == puVar4) {
      uVar13 = *puVar4;
      _Var11._M_p = &stack0xfffffffffffffe80;
    }
    else {
      uVar13 = *puVar4;
    }
    sVar12 = plVar2[1];
    *plVar2 = (long)puVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    detail::stringify_impl<unsigned_int>(&local_170,(uint *)&stack0xfffffffffffffe44);
    std::operator+(&local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffe70,&local_170);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_110);
    plVar2 = (long *)*plVar3;
    plVar5 = plVar3 + 2;
    if (plVar2 == plVar5) {
      local_1a8 = *plVar5;
      lStack_1a0 = plVar3[3];
      plVar2 = &local_1a8;
    }
    else {
      local_1a8 = *plVar5;
    }
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_48 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    pcStack_40 = "run";
    local_38 = 0x1b;
    msg_00._M_len._4_4_ = uVar10;
    msg_00._M_len._0_4_ = in_stack_fffffffffffffe40;
    msg_00._M_str = (char *)plVar2;
    loc_00.function = (char *)sVar12;
    loc_00.file = _Var11._M_p;
    loc_00.line = uVar13;
    assertFail(msg_00,loc_00);
  }
  cVar1 = '\0';
  uVar6 = 0;
  local_198 = 0;
  do {
    lVar8 = 0;
    do {
      local_198 = local_198 |
                  (ulong)((0xffUL >> (uVar6 & 0x3f) & 1) != 0) << (cVar1 + (char)lVar8 & 0x3fU);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 2);
    cVar1 = cVar1 + '\x02';
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0x20);
  uVar10 = 0xffff;
  if (local_198 != 0xffff) {
    detail::stringify_impl<unsigned_long>(&local_150,&local_198);
    std::operator+(&local_130,
                   "Comparison failed: detail::duplBits_naive(0xff, 2) == 0xffffu (with \"detail::duplBits_naive(0xff, 2)\"="
                   ,&local_150);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_130);
    _Var11._M_p = (pointer)*plVar2;
    puVar4 = (unsigned_long *)(plVar2 + 2);
    if ((unsigned_long *)_Var11._M_p == puVar4) {
      uVar13 = *puVar4;
      _Var11._M_p = &stack0xfffffffffffffe80;
    }
    else {
      uVar13 = *puVar4;
    }
    sVar12 = plVar2[1];
    *plVar2 = (long)puVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    detail::stringify_impl<unsigned_int>(&local_170,(uint *)&stack0xfffffffffffffe44);
    std::operator+(&local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffe70,&local_170);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_110);
    plVar2 = (long *)*plVar3;
    plVar5 = plVar3 + 2;
    if (plVar2 == plVar5) {
      local_1a8 = *plVar5;
      lStack_1a0 = plVar3[3];
      plVar2 = &local_1a8;
    }
    else {
      local_1a8 = *plVar5;
    }
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_60 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    pcStack_58 = "run";
    local_50 = 0x1c;
    msg_01._M_len._4_4_ = uVar10;
    msg_01._M_len._0_4_ = in_stack_fffffffffffffe40;
    msg_01._M_str = (char *)plVar2;
    loc_01.function = (char *)sVar12;
    loc_01.file = _Var11._M_p;
    loc_01.line = uVar13;
    assertFail(msg_01,loc_01);
  }
  lVar8 = 0;
  local_198 = 0;
  do {
    local_198 = local_198 | lVar8 == 0;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x40);
  uVar10 = 1;
  if (local_198 != 1) {
    detail::stringify_impl<unsigned_long>(&local_150,&local_198);
    std::operator+(&local_130,
                   "Comparison failed: detail::duplBits_naive(1, 1) == 1u (with \"detail::duplBits_naive(1, 1)\"="
                   ,&local_150);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_130);
    _Var11._M_p = (pointer)*plVar2;
    puVar4 = (unsigned_long *)(plVar2 + 2);
    if ((unsigned_long *)_Var11._M_p == puVar4) {
      uVar13 = *puVar4;
      _Var11._M_p = &stack0xfffffffffffffe80;
    }
    else {
      uVar13 = *puVar4;
    }
    sVar12 = plVar2[1];
    *plVar2 = (long)puVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    detail::stringify_impl<unsigned_int>(&local_170,(uint *)&stack0xfffffffffffffe44);
    std::operator+(&local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffe70,&local_170);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_110);
    plVar2 = (long *)*plVar3;
    plVar5 = plVar3 + 2;
    if (plVar2 == plVar5) {
      local_1a8 = *plVar5;
      lStack_1a0 = plVar3[3];
      plVar2 = &local_1a8;
    }
    else {
      local_1a8 = *plVar5;
    }
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_78 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    pcStack_70 = "run";
    local_68 = 0x1d;
    msg_02._M_len._4_4_ = uVar10;
    msg_02._M_len._0_4_ = in_stack_fffffffffffffe40;
    msg_02._M_str = (char *)plVar2;
    loc_02.function = (char *)sVar12;
    loc_02.file = _Var11._M_p;
    loc_02.line = uVar13;
    assertFail(msg_02,loc_02);
  }
  cVar1 = '\0';
  lVar8 = 0;
  local_198 = 0;
  do {
    lVar7 = 0;
    do {
      local_198 = local_198 | (1UL >> ((byte)lVar8 & 0x3f)) << (cVar1 + (char)lVar7 & 0x3fU);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 2);
    cVar1 = cVar1 + '\x02';
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x20);
  uVar10 = 3;
  if (local_198 != 3) {
    detail::stringify_impl<unsigned_long>(&local_150,&local_198);
    std::operator+(&local_130,
                   "Comparison failed: detail::duplBits_naive(1, 2) == 3u (with \"detail::duplBits_naive(1, 2)\"="
                   ,&local_150);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_130);
    _Var11._M_p = (pointer)*plVar2;
    puVar4 = (unsigned_long *)(plVar2 + 2);
    if ((unsigned_long *)_Var11._M_p == puVar4) {
      uVar13 = *puVar4;
      _Var11._M_p = &stack0xfffffffffffffe80;
    }
    else {
      uVar13 = *puVar4;
    }
    sVar12 = plVar2[1];
    *plVar2 = (long)puVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    detail::stringify_impl<unsigned_int>(&local_170,(uint *)&stack0xfffffffffffffe44);
    std::operator+(&local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffe70,&local_170);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_110);
    plVar2 = (long *)*plVar3;
    plVar5 = plVar3 + 2;
    if (plVar2 == plVar5) {
      local_1a8 = *plVar5;
      lStack_1a0 = plVar3[3];
      plVar2 = &local_1a8;
    }
    else {
      local_1a8 = *plVar5;
    }
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_90 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    pcStack_88 = "run";
    local_80 = 0x1e;
    msg_03._M_len._4_4_ = uVar10;
    msg_03._M_len._0_4_ = in_stack_fffffffffffffe40;
    msg_03._M_str = (char *)plVar2;
    loc_03.function = (char *)sVar12;
    loc_03.file = _Var11._M_p;
    loc_03.line = uVar13;
    assertFail(msg_03,loc_03);
  }
  cVar1 = '\0';
  lVar8 = 0;
  local_198 = 0;
  do {
    lVar7 = 0;
    do {
      local_198 = local_198 | (1UL >> ((byte)lVar8 & 0x3f)) << (cVar1 + (char)lVar7 & 0x3fU);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    cVar1 = cVar1 + '\x04';
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x10);
  uVar10 = 0xf;
  if (local_198 != 0xf) {
    detail::stringify_impl<unsigned_long>(&local_150,&local_198);
    std::operator+(&local_130,
                   "Comparison failed: detail::duplBits_naive(1, 4) == 0xfu (with \"detail::duplBits_naive(1, 4)\"="
                   ,&local_150);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_130);
    _Var11._M_p = (pointer)*plVar2;
    puVar4 = (unsigned_long *)(plVar2 + 2);
    if ((unsigned_long *)_Var11._M_p == puVar4) {
      uVar13 = *puVar4;
      _Var11._M_p = &stack0xfffffffffffffe80;
    }
    else {
      uVar13 = *puVar4;
    }
    sVar12 = plVar2[1];
    *plVar2 = (long)puVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    detail::stringify_impl<unsigned_int>(&local_170,(uint *)&stack0xfffffffffffffe44);
    std::operator+(&local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffe70,&local_170);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_110);
    plVar2 = (long *)*plVar3;
    plVar5 = plVar3 + 2;
    if (plVar2 == plVar5) {
      local_1a8 = *plVar5;
      lStack_1a0 = plVar3[3];
      plVar2 = &local_1a8;
    }
    else {
      local_1a8 = *plVar5;
    }
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    pcStack_a0 = "run";
    local_98 = 0x1f;
    msg_04._M_len._4_4_ = uVar10;
    msg_04._M_len._0_4_ = in_stack_fffffffffffffe40;
    msg_04._M_str = (char *)plVar2;
    loc_04.function = (char *)sVar12;
    loc_04.file = _Var11._M_p;
    loc_04.line = uVar13;
    assertFail(msg_04,loc_04);
  }
  cVar1 = '\0';
  lVar8 = 0;
  local_198 = 0;
  do {
    lVar7 = 0;
    do {
      local_198 = local_198 | (1UL >> ((byte)lVar8 & 0x3f)) << (cVar1 + (char)lVar7 & 0x3fU);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 8);
    cVar1 = cVar1 + '\b';
    lVar8 = lVar8 + 1;
  } while (lVar8 != 8);
  uVar10 = 0xff;
  if (local_198 != 0xff) {
    detail::stringify_impl<unsigned_long>(&local_150,&local_198);
    std::operator+(&local_130,
                   "Comparison failed: detail::duplBits_naive(1, 8) == 0xffu (with \"detail::duplBits_naive(1, 8)\"="
                   ,&local_150);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_130);
    _Var11._M_p = (pointer)*plVar2;
    puVar4 = (unsigned_long *)(plVar2 + 2);
    if ((unsigned_long *)_Var11._M_p == puVar4) {
      uVar13 = *puVar4;
      _Var11._M_p = &stack0xfffffffffffffe80;
    }
    else {
      uVar13 = *puVar4;
    }
    sVar12 = plVar2[1];
    *plVar2 = (long)puVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    detail::stringify_impl<unsigned_int>(&local_170,(uint *)&stack0xfffffffffffffe44);
    std::operator+(&local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffe70,&local_170);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_110);
    plVar2 = (long *)*plVar3;
    plVar5 = plVar3 + 2;
    if (plVar2 == plVar5) {
      local_1a8 = *plVar5;
      lStack_1a0 = plVar3[3];
      plVar2 = &local_1a8;
    }
    else {
      local_1a8 = *plVar5;
    }
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    pcStack_b8 = "run";
    local_b0 = 0x20;
    msg_05._M_len._4_4_ = uVar10;
    msg_05._M_len._0_4_ = in_stack_fffffffffffffe40;
    msg_05._M_str = (char *)plVar2;
    loc_05.function = (char *)sVar12;
    loc_05.file = _Var11._M_p;
    loc_05.line = uVar13;
    assertFail(msg_05,loc_05);
  }
  cVar1 = '\0';
  lVar8 = 0;
  local_198 = 0;
  do {
    lVar7 = 0;
    do {
      local_198 = local_198 | (1UL >> ((byte)lVar8 & 0x3f)) << (cVar1 + (char)lVar7 & 0x3fU);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x10);
    cVar1 = cVar1 + '\x10';
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  uVar10 = 0xffff;
  if (local_198 == 0xffff) {
    cVar1 = '\0';
    local_198 = 0;
    lVar8 = 0;
    do {
      lVar7 = 0;
      do {
        local_198 = local_198 | (1UL >> ((byte)lVar8 & 0x3f)) << (cVar1 + (char)lVar7 & 0x3fU);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x20);
      cVar1 = cVar1 + ' ';
      bVar9 = lVar8 == 0;
      lVar8 = lVar8 + 1;
    } while (bVar9);
    uVar10 = 0xffffffff;
    if (local_198 == 0xffffffff) {
      return;
    }
    detail::stringify_impl<unsigned_long>(&local_150,&local_198);
    std::operator+(&local_130,
                   "Comparison failed: detail::duplBits_naive(1, 32) == 0xffffffffu (with \"detail::duplBits_naive(1, 32)\"="
                   ,&local_150);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_130);
    _Var11._M_p = (pointer)*plVar2;
    puVar4 = (unsigned_long *)(plVar2 + 2);
    if ((unsigned_long *)_Var11._M_p == puVar4) {
      uVar13 = *puVar4;
      _Var11._M_p = &stack0xfffffffffffffe80;
    }
    else {
      uVar13 = *puVar4;
    }
    sVar12 = plVar2[1];
    *plVar2 = (long)puVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    detail::stringify_impl<unsigned_int>(&local_170,(uint *)&stack0xfffffffffffffe44);
    std::operator+(&local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffe70,&local_170);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_110);
    plVar2 = (long *)*plVar3;
    plVar5 = plVar3 + 2;
    if (plVar2 == plVar5) {
      local_1a8 = *plVar5;
      lStack_1a0 = plVar3[3];
      plVar2 = &local_1a8;
    }
    else {
      local_1a8 = *plVar5;
    }
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    pcStack_e8 = "run";
    local_e0 = 0x22;
    msg_07._M_len._4_4_ = uVar10;
    msg_07._M_len._0_4_ = in_stack_fffffffffffffe40;
    msg_07._M_str = (char *)plVar2;
    loc_07.function = (char *)sVar12;
    loc_07.file = _Var11._M_p;
    loc_07.line = uVar13;
    assertFail(msg_07,loc_07);
  }
  detail::stringify_impl<unsigned_long>(&local_150,&local_198);
  std::operator+(&local_130,
                 "Comparison failed: detail::duplBits_naive(1, 16) == 0xffffu (with \"detail::duplBits_naive(1, 16)\"="
                 ,&local_150);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_130);
  _Var11._M_p = (pointer)*plVar2;
  puVar4 = (unsigned_long *)(plVar2 + 2);
  if ((unsigned_long *)_Var11._M_p == puVar4) {
    uVar13 = *puVar4;
    _Var11._M_p = &stack0xfffffffffffffe80;
  }
  else {
    uVar13 = *puVar4;
  }
  sVar12 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  detail::stringify_impl<unsigned_int>(&local_170,(uint *)&stack0xfffffffffffffe44);
  std::operator+(&local_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffe70,&local_170);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_110);
  plVar2 = (long *)*plVar3;
  plVar5 = plVar3 + 2;
  if (plVar2 == plVar5) {
    local_1a8 = *plVar5;
    lStack_1a0 = plVar3[3];
    plVar2 = &local_1a8;
  }
  else {
    local_1a8 = *plVar5;
  }
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp";
  pcStack_d0 = "run";
  local_c8 = 0x21;
  msg_06._M_len._4_4_ = uVar10;
  msg_06._M_len._0_4_ = in_stack_fffffffffffffe40;
  msg_06._M_str = (char *)plVar2;
  loc_06.function = (char *)sVar12;
  loc_06.file = _Var11._M_p;
  loc_06.line = uVar13;
  assertFail(msg_06,loc_06);
}

Assistant:

BITMANIP_TEST(bitileave, duplBits_naive_manual)
{
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(0xf, 0), 0u);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(0xf, 2), 0xffu);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(0x55, 2), 0x3333u);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(0xff, 2), 0xffffu);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(1, 1), 1u);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(1, 2), 3u);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(1, 4), 0xfu);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(1, 8), 0xffu);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(1, 16), 0xffffu);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(1, 32), 0xffffffffu);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(1, 64), 0xffffffffffffffffu);
}